

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.h
# Opt level: O0

void __thiscall trieste::PassDef::compile_rules(PassDef *this)

{
  anon_class_16_2_a97d8124 f;
  pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>
  *this_00;
  bool bVar1;
  reference this_01;
  set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_> *psVar2;
  reference t;
  DefaultMap<std::vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>_>
  *rules;
  Token *parent;
  iterator __end4;
  iterator __begin4;
  set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_> *__range4;
  undefined1 local_50 [8];
  anon_class_16_2_a97d8124 add;
  set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_> *parents;
  set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_> *starts;
  pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>
  *rule;
  iterator __end2;
  iterator __begin2;
  vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
  *__range2;
  PassDef *this_local;
  
  detail::
  DefaultMap<trieste::detail::DefaultMap<std::vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>_>_>
  ::clear(&this->rule_map);
  __end2._M_current =
       (pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>
        *)CLI::std::
          vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
          ::begin(&this->rules_);
  rule = (pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>
          *)CLI::std::
            vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
            ::end(&this->rules_);
  while (bVar1 = __gnu_cxx::
                 operator==<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_*,_std::vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>_>
                           (&__end2,(__normal_iterator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_*,_std::vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>_>
                                     *)&rule), ((bVar1 ^ 0xffU) & 1) != 0) {
    this_01 = __gnu_cxx::
              __normal_iterator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_*,_std::vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>_>
              ::operator*(&__end2);
    psVar2 = detail::Pattern::get_starts((Pattern *)this_01);
    add.rule = (pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>
                *)detail::Pattern::get_parents((Pattern *)this_01);
    local_50 = (undefined1  [8])psVar2;
    add.starts = (set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_> *)
                 this_01;
    bVar1 = std::set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>::
            empty((set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_> *
                  )add.rule);
    this_00 = add.rule;
    if (bVar1) {
      f.rule = (pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>
                *)add.starts;
      f.starts = (set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_> *)
                 local_50;
      detail::
      DefaultMap<trieste::detail::DefaultMap<std::vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,std::function<std::shared_ptr<trieste::NodeDef>(trieste::Match&)>>,std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,std::function<std::shared_ptr<trieste::NodeDef>(trieste::Match&)>>>>>>
      ::
      modify_all<trieste::PassDef::compile_rules()::_lambda(trieste::detail::DefaultMap<std::vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,std::function<std::shared_ptr<trieste::NodeDef>(trieste::Match&)>>,std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,std::function<std::shared_ptr<trieste::NodeDef>(trieste::Match&)>>>>>&)_1_>
                ((DefaultMap<trieste::detail::DefaultMap<std::vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,std::function<std::shared_ptr<trieste::NodeDef>(trieste::Match&)>>,std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,std::function<std::shared_ptr<trieste::NodeDef>(trieste::Match&)>>>>>>
                  *)&this->rule_map,f);
    }
    else {
      __end4 = std::set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
               ::begin((set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
                        *)add.rule);
      parent = (Token *)std::
                        set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
                        ::end((set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
                               *)this_00);
      while (bVar1 = std::operator==(&__end4,(_Self *)&parent), ((bVar1 ^ 0xffU) & 1) != 0) {
        t = std::_Rb_tree_const_iterator<trieste::Token>::operator*(&__end4);
        rules = detail::
                DefaultMap<trieste::detail::DefaultMap<std::vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>_>_>
                ::modify(&this->rule_map,t);
        compile_rules::anon_class_16_2_a97d8124::operator()
                  ((anon_class_16_2_a97d8124 *)local_50,rules);
        std::_Rb_tree_const_iterator<trieste::Token>::operator++(&__end4);
      }
    }
    __gnu_cxx::
    __normal_iterator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_*,_std::vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void compile_rules()
    {
      rule_map.clear();

      for (auto& rule : rules_)
      {
        const auto& starts = rule.first.value.get_starts();
        const auto& parents = rule.first.value.get_parents();

        //  This is used to add a rule under a specific parent, or to the
        //  default.
        auto add = [&](detail::DefaultMap<
                       std::vector<detail::PatternEffect<Node>>>& rules) {
          if (starts.empty())
          {
            // If there are no starts, then this rule applies to all tokens.
            rules.modify_all([&](std::vector<detail::PatternEffect<Node>>& v) {
              v.push_back(rule);
            });
          }
          else
          {
            for (const auto& start : starts)
            {
              // Add the rule to the specific start token.
              rules.modify(start).push_back(rule);
            }
          }
        };

        if (parents.empty())
        {
          rule_map.modify_all(add);
        }
        else
        {
          for (const auto& parent : parents)
          {
            add(rule_map.modify(parent));
          }
        }
      }
    }